

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

StringToDoubleMap * __thiscall
CoreML::Specification::StringToDoubleMap::New(StringToDoubleMap *this,Arena *arena)

{
  StringToDoubleMap *this_00;
  
  this_00 = (StringToDoubleMap *)operator_new(0x38);
  StringToDoubleMap(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::StringToDoubleMap>(arena,this_00);
  }
  return this_00;
}

Assistant:

StringToDoubleMap* StringToDoubleMap::New(::google::protobuf::Arena* arena) const {
  StringToDoubleMap* n = new StringToDoubleMap;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}